

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::MessageBuilder::MessageBuilder
          (MessageBuilder *this,StringRef macroName,SourceLineInfo *lineInfo,OfType type)

{
  StringRef _macroName;
  size_type in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  OfType _type;
  SourceLineInfo *in_stack_ffffffffffffffb8;
  MessageInfo *in_stack_ffffffffffffffc0;
  
  _type = (OfType)((ulong)in_RDI >> 0x20);
  MessageStream::MessageStream((MessageStream *)0x1cd93c);
  _macroName.m_size = in_RDX;
  _macroName.m_start = in_RSI;
  MessageInfo::MessageInfo(in_stack_ffffffffffffffc0,_macroName,in_stack_ffffffffffffffb8,_type);
  return;
}

Assistant:

MessageBuilder( StringRef macroName,
                        SourceLineInfo const& lineInfo,
                        ResultWas::OfType type ):
            m_info(macroName, lineInfo, type) {}